

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O3

void scriptnum_tests::RunCreate(int64_t *num)

{
  int iVar1;
  undefined1 **ppuVar2;
  char **tbs;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  ulong uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  CScriptNum scriptnum;
  CScriptNum scriptnum_1;
  CScriptNum10 bignum;
  check_type cVar6;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 local_a0 [8];
  bool local_98;
  undefined7 uStack_97;
  pointer local_90;
  char **local_88;
  assertion_result local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (char *)*num;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_50 = "";
  ppuVar2 = &local_68;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2d;
  file.m_begin = (iterator)&local_58;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_40 = local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar2,msg);
  iVar1 = verify((EVP_PKEY_CTX *)&local_40,(uchar *)&local_48,siglen,(uchar *)ppuVar2,(size_t)in_R8)
  ;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar1,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88 = &local_b0;
  local_b0 = "verify(bignum, scriptnum)";
  local_a8 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_b8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar6,(size_t)&local_c0,0x2d);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_a8 = "";
  ppuVar2 = &local_d0;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2e;
  file_00.m_begin = (iterator)&local_b0;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar2,msg_00);
  local_100 = local_40;
  if ((long)local_40 < -0x7fffffff) {
    local_100 = (char *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_100) {
    local_100 = (char *)0x7fffffff;
  }
  local_110 = local_48;
  if ((long)local_48 < -0x7fffffff) {
    local_110 = (char *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_110) {
    local_110 = (char *)0x7fffffff;
  }
  iVar1 = verify((EVP_PKEY_CTX *)&local_100,(uchar *)&local_110,siglen_00,(uchar *)ppuVar2,
                 (size_t)pvVar4);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar1,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88 = &local_e0;
  local_e0 = "verify(CScriptNum10(bignum.getint()), CScriptNum(scriptnum.getint()))";
  local_d8 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_e8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar6,(size_t)&local_f0,0x2e);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_d8 = "";
  tbs = &local_100;
  local_100 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2f;
  file_01.m_begin = (iterator)&local_e0;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)tbs,msg_01);
  local_130 = local_48;
  if ((long)local_48 < -0x7fffffff) {
    local_130 = (char *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_130) {
    local_130 = (char *)0x7fffffff;
  }
  local_150 = (char *)0xffffffff80000000;
  if (-0x80000000 < (long)local_40) {
    local_150 = local_40;
  }
  if (0x7ffffffe < (long)local_150) {
    local_150 = (char *)0x7fffffff;
  }
  iVar1 = verify((EVP_PKEY_CTX *)&local_130,(uchar *)&local_150,siglen_01,(uchar *)tbs,
                 (size_t)pvVar4);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar1,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "verify(CScriptNum10(scriptnum.getint()), CScriptNum(bignum.getint()))";
  local_108 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_110;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_118 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar6,(size_t)&local_120,0x2f);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_108 = "";
  local_130 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x30;
  file_02.m_begin = (iterator)&local_110;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  local_138 = local_48;
  if ((long)local_48 < -0x7fffffff) {
    local_138 = (char *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_138) {
    local_138 = (char *)0x7fffffff;
  }
  local_140 = (char *)0xffffffff80000000;
  if (-0x80000000 < (long)local_40) {
    local_140 = local_40;
  }
  if (0x7ffffffe < (long)local_140) {
    local_140 = (char *)0x7fffffff;
  }
  iVar1 = verify((EVP_PKEY_CTX *)&local_138,(uchar *)&local_140,(size_t)local_140,
                 (uchar *)0xffffffff80000001,(size_t)pvVar4);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar1,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "verify(CScriptNum10(CScriptNum10(scriptnum.getint()).getint()), CScriptNum(CScriptNum(bignum.getint()).getint()))"
  ;
  local_148 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_158 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_88 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar6,(size_t)&local_160,0x30);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_58 = (char *)*num;
  CScriptNum::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,(int64_t *)&local_58)
  ;
  uVar3 = CONCAT71(uStack_97,local_98) - (long)local_a0;
  if (local_a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a0,(long)local_90 - (long)local_a0);
  }
  if (uVar3 < 5) {
    CheckCreateVch((int64_t *)*num);
  }
  else {
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x99;
    file_03.m_begin = (iterator)&local_170;
    msg_03.m_end = pvVar5;
    msg_03.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
               msg_03);
    CheckCreateVch((int64_t *)*num);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
    ;
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x99;
    file_04.m_begin = (iterator)&local_190;
    msg_04.m_end = pvVar5;
    msg_04.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a0,
               msg_04);
    local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
    local_80.m_message.px = (element_type *)0x0;
    local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_98 = false;
    local_a0 = (undefined1  [8])&PTR__lazy_ostream_013b26a0;
    local_90 = boost::unit_test::lazy_ostream::inst;
    local_88 = (char **)0xf0e9b2;
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scriptnum_tests.cpp"
    ;
    local_1a8 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_80,(lazy_ostream *)local_a0,1,1,WARN,_cVar6,(size_t)&local_1b0,0x99);
    boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void RunCreate(const int64_t& num)
{
    CheckCreateInt(num);
    CScriptNum scriptnum(num);
    if (scriptnum.getvch().size() <= CScriptNum::nDefaultMaxNumSize)
        CheckCreateVch(num);
    else
    {
        BOOST_CHECK_THROW (CheckCreateVch(num), scriptnum10_error);
    }
}